

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O0

void __thiscall myutils::IpcConnection::IpcConnection(IpcConnection *this)

{
  IpcConnection *local_c0;
  code *local_b8;
  undefined8 local_b0;
  type local_a8;
  Closure local_90;
  IpcConnection *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  Closure local_40;
  IpcConnection *local_10;
  IpcConnection *this_local;
  
  local_10 = this;
  Connection::Connection(&this->super_Connection);
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection)._vptr_Connection = (_func_int **)&PTR__IpcConnection_00282650;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&DAT_002826a0;
  std::__cxx11::string::string((string *)&this->m_addr);
  std::mutex::mutex(&this->m_send_mtx);
  this->m_callback = (Connection_Callback *)0x0;
  this->m_should_exit = false;
  this->m_connected = false;
  this->m_my_id = 0;
  this->m_my_shmem = (FileMapping *)0x0;
  this->m_svr_shmem = (FileMapping *)0x0;
  this->m_recv_queue = (ShmemQueue *)0x0;
  this->m_send_queue = (ShmemQueue *)0x0;
  this->m_recv_thread = (thread *)0x0;
  this->m_slot_info = (ConnectionSlotInfo *)0x0;
  this->m_slot = (ConnectionSlot *)0x0;
  this->m_sem_send = (SharedSemaphore *)0x0;
  this->m_sem_recv = (SharedSemaphore *)0x0;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_last_connect_time);
  this->m_socket = -1;
  local_68 = check_connection;
  local_60 = 0;
  local_70 = this;
  std::bind<void(myutils::IpcConnection::*)(),myutils::IpcConnection*>
            (&local_58,(offset_in_IpcConnection_to_subr *)&local_68,&local_70);
  std::function<void()>::
  function<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,void>
            ((function<void()> *)&local_40,&local_58);
  loop::MessageLoop::post_delayed_task(&(this->super_MsgLoopRun).m_msg_loop,&local_40,500);
  std::function<void_()>::~function(&local_40);
  local_b8 = on_idle_timer;
  local_b0 = 0;
  local_c0 = this;
  std::bind<void(myutils::IpcConnection::*)(),myutils::IpcConnection*>
            (&local_a8,(offset_in_IpcConnection_to_subr *)&local_b8,&local_c0);
  std::function<void()>::
  function<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,void>
            ((function<void()> *)&local_90,&local_a8);
  loop::MessageLoop::post_delayed_task(&(this->super_MsgLoopRun).m_msg_loop,&local_90,1000);
  std::function<void_()>::~function(&local_90);
  return;
}

Assistant:

IpcConnection::IpcConnection()
    : m_callback(nullptr)
    , m_should_exit(false)
    , m_connected(false)
    , m_my_id(0)
    , m_my_shmem(nullptr)
    , m_svr_shmem(nullptr)
    , m_recv_queue(nullptr)
    , m_send_queue(nullptr)
    , m_recv_thread(nullptr)
    , m_slot_info(nullptr)
    , m_slot(nullptr)
    , m_sem_send(nullptr)
    , m_sem_recv(nullptr)
    , m_socket(INVALID_SOCKET)
{
    m_msg_loop.post_delayed_task(bind(&IpcConnection::check_connection, this),  500);
    m_msg_loop.post_delayed_task(bind(&IpcConnection::on_idle_timer,    this), 1000);
}